

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O3

void TranslateFunctionCall(ExpressionTranslateContext *ctx,ExprFunctionCall *expression)

{
  ExprBase *pEVar1;
  ExprBase *expression_00;
  TypeBase *pTVar2;
  undefined8 *puVar3;
  bool bVar4;
  ExprBase **ppEVar5;
  char *format;
  
  pEVar1 = expression->function;
  if ((pEVar1 == (ExprBase *)0x0) || (pEVar1->typeID != 0x26)) {
    pTVar2 = pEVar1->type;
    if ((pTVar2 == (TypeBase *)0x0) || (pTVar2->typeID != 0x15)) {
      __assert_fail("!\"unknwon type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                    ,0x63b,
                    "void TranslateFunctionCall(ExpressionTranslateContext &, ExprFunctionCall *)");
    }
    Print(ctx,"((");
    TranslateTypeName(ctx,(TypeBase *)pTVar2[1]._vptr_TypeBase);
    Print(ctx,"(*)(");
    for (puVar3 = *(undefined8 **)&pTVar2[1].typeID; puVar3 != (undefined8 *)0x0;
        puVar3 = (undefined8 *)puVar3[1]) {
      TranslateTypeName(ctx,(TypeBase *)*puVar3);
      Print(ctx,", ");
    }
    Print(ctx,"void*))(*__nullcFM)[(");
    Translate(ctx,expression->function);
    Print(ctx,").id])(");
    for (pEVar1 = (expression->arguments).head; pEVar1 != (ExprBase *)0x0; pEVar1 = pEVar1->next) {
      Translate(ctx,pEVar1);
      Print(ctx,", ");
    }
    ppEVar5 = &expression->function;
    Print(ctx,"(");
    format = ").context)";
  }
  else {
    TranslateFunctionName(ctx,(FunctionData *)pEVar1[1]._vptr_ExprBase);
    bVar4 = UseNonStaticTemplate(ctx,(FunctionData *)pEVar1[1]._vptr_ExprBase);
    if (bVar4) {
      Print(ctx,"<0>");
    }
    Print(ctx,"(");
    for (expression_00 = (expression->arguments).head; expression_00 != (ExprBase *)0x0;
        expression_00 = expression_00->next) {
      Translate(ctx,expression_00);
      Print(ctx,", ");
    }
    ppEVar5 = (ExprBase **)&pEVar1[1].typeID;
    format = ")";
  }
  Translate(ctx,*ppEVar5);
  Print(ctx,format);
  return;
}

Assistant:

void TranslateFunctionCall(ExpressionTranslateContext &ctx, ExprFunctionCall *expression)
{
	if(ExprFunctionAccess *functionAccess = getType<ExprFunctionAccess>(expression->function))
	{
		TranslateFunctionName(ctx, functionAccess->function);

		if(UseNonStaticTemplate(ctx, functionAccess->function))
			Print(ctx, "<0>");

		Print(ctx, "(");

		for(ExprBase *value = expression->arguments.head; value; value = value->next)
		{
			Translate(ctx, value);

			Print(ctx, ", ");
		}

		Translate(ctx, functionAccess->context);

		Print(ctx, ")");
	}
	else if(TypeFunction *typeFunction = getType<TypeFunction>(expression->function->type))
	{
		// TODO: side effects may be performed multiple times since the node is translated two times
		Print(ctx, "((");
		TranslateTypeName(ctx, typeFunction->returnType);
		Print(ctx, "(*)(");

		for(TypeHandle *curr = typeFunction->arguments.head; curr; curr = curr->next)
		{
			TranslateTypeName(ctx, curr->type);

			Print(ctx, ", ");
		}

		Print(ctx, "void*))(*__nullcFM)[(");
		Translate(ctx, expression->function);
		Print(ctx, ").id])(");

		for(ExprBase *value = expression->arguments.head; value; value = value->next)
		{
			Translate(ctx, value);

			Print(ctx, ", ");
		}

		Print(ctx, "(");
		Translate(ctx, expression->function);
		Print(ctx, ").context)");
	}
	else
	{
		assert(!"unknwon type");
	}
}